

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::PolyOffsetBuilder::DoSquare(PolyOffsetBuilder *this,double mul)

{
  size_t sVar1;
  pointer pvVar2;
  pointer pDVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  undefined8 in_XMM0_Qb;
  double dVar9;
  undefined1 auVar10 [16];
  IntPoint local_48;
  undefined1 local_38 [16];
  double local_20;
  IntPoint local_18;
  
  sVar1 = this->m_j;
  pvVar2 = (this->m_p).
           super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar3 = (this->normals).
           super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = *(long *)&pvVar2[this->m_i].
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl;
  lVar6 = sVar1 * 0x10;
  sVar5 = this->m_k;
  dVar8 = this->m_delta;
  dVar9 = pDVar3[sVar5].X * dVar8 + (double)*(long *)(lVar4 + lVar6);
  uVar7 = -(ulong)(dVar9 < 0.0);
  local_18.X = (long64)((double)(~uVar7 & 0x3fe0000000000000 | uVar7 & 0xbfe0000000000000) + dVar9);
  dVar9 = pDVar3[sVar5].Y * dVar8 + (double)*(long *)(lVar4 + 8 + lVar6);
  uVar7 = -(ulong)(dVar9 < 0.0);
  local_18.Y = (long64)((double)(~uVar7 & 0x3fe0000000000000 | uVar7 & 0xbfe0000000000000) + dVar9);
  lVar4 = *(long *)&pvVar2[this->m_i].
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl;
  dVar9 = pDVar3[sVar1].X * dVar8 + (double)*(long *)(lVar4 + lVar6);
  uVar7 = -(ulong)(dVar9 < 0.0);
  local_48.X = (long64)((double)(~uVar7 & 0x3fe0000000000000 | uVar7 & 0xbfe0000000000000) + dVar9);
  auVar10._8_4_ = (int)in_XMM0_Qb;
  auVar10._0_8_ = mul;
  auVar10._12_4_ = (int)((ulong)in_XMM0_Qb >> 0x20);
  dVar9 = pDVar3[sVar1].Y * dVar8 + (double)*(long *)(lVar4 + 8 + lVar6);
  uVar7 = -(ulong)(dVar9 < 0.0);
  local_48.Y = (long64)((double)(~uVar7 & 0x3fe0000000000000 | uVar7 & 0xbfe0000000000000) + dVar9);
  if (0.0 <= (pDVar3[sVar1].Y * pDVar3[sVar5].X - pDVar3[sVar1].X * pDVar3[sVar5].Y) * dVar8) {
    local_38 = auVar10;
    local_20 = atan2(pDVar3[sVar5].Y,pDVar3[sVar5].X);
    pDVar3 = (this->normals).
             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar8 = atan2(-pDVar3[this->m_j].Y,-pDVar3[this->m_j].X);
    dVar8 = ABS(dVar8 - local_20);
    dVar8 = tan((3.141592653589793 -
                (double)(~-(ulong)(3.141592653589793 < dVar8) & (ulong)dVar8 |
                        (ulong)(6.283185307179586 - dVar8) & -(ulong)(3.141592653589793 < dVar8))) *
                0.25);
    local_38._0_8_ = ABS((double)local_38._0_8_ * this->m_delta) * dVar8;
    local_38._8_8_ = local_38._8_8_ & 0x7fffffffffffffff;
    pDVar3 = (this->normals).
             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_18.X = (long64)((double)local_18.X - pDVar3[this->m_k].Y * (double)local_38._0_8_);
    local_18.Y = (long64)(pDVar3[this->m_k].X * (double)local_38._0_8_ + (double)local_18.Y);
    AddPoint(this,&local_18);
    pDVar3 = (this->normals).
             super__Vector_base<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_48.X = (long64)(pDVar3[this->m_j].Y * (double)local_38._0_8_ + (double)local_48.X);
    local_48.Y = (long64)((double)local_48.Y - (double)local_38._0_8_ * pDVar3[this->m_j].X);
  }
  else {
    AddPoint(this,&local_18);
    AddPoint(this,(IntPoint *)
                  (this->m_j * 0x10 +
                  *(long *)&(this->m_p).
                            super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[this->m_i].
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl));
  }
  AddPoint(this,&local_48);
  return;
}

Assistant:

void DoSquare(double mul = 1.0)
{
    IntPoint pt1 = IntPoint((long64)Round(m_p[m_i][m_j].X + normals[m_k].X * m_delta),
        (long64)Round(m_p[m_i][m_j].Y + normals[m_k].Y * m_delta));
    IntPoint pt2 = IntPoint((long64)Round(m_p[m_i][m_j].X + normals[m_j].X * m_delta),
        (long64)Round(m_p[m_i][m_j].Y + normals[m_j].Y * m_delta));
    if ((normals[m_k].X * normals[m_j].Y - normals[m_j].X * normals[m_k].Y) * m_delta >= 0)
    {
      double a1 = std::atan2(normals[m_k].Y, normals[m_k].X);
      double a2 = std::atan2(-normals[m_j].Y, -normals[m_j].X);
      a1 = std::fabs(a2 - a1);
      if (a1 > pi) a1 = pi * 2 - a1;
      double dx = std::tan((pi - a1)/4) * std::fabs(m_delta * mul);
      pt1 = IntPoint((long64)(pt1.X -normals[m_k].Y * dx),
        (long64)(pt1.Y + normals[m_k].X * dx));
      AddPoint(pt1);
      pt2 = IntPoint((long64)(pt2.X + normals[m_j].Y * dx),
        (long64)(pt2.Y -normals[m_j].X * dx));
      AddPoint(pt2);
    }
    else
    {
      AddPoint(pt1);
      AddPoint(m_p[m_i][m_j]);
      AddPoint(pt2);
    }
}